

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

uint32_t countarray(GCtab *t,uint32_t *bins)

{
  TValue *array;
  uint32_t top;
  uint32_t n;
  uint32_t i;
  uint32_t b;
  uint32_t na;
  uint32_t *bins_local;
  GCtab *t_local;
  uint32_t local_4;
  
  if (t->asize == 0) {
    local_4 = 0;
  }
  else {
    b = 0;
    i = 0;
    na = 0;
    while ((b < 0x1c &&
           ((top = 2 << ((byte)b & 0x1f), top < t->asize || (top = t->asize - 1, i <= top))))) {
      n = 0;
      for (; i <= top; i = i + 1) {
        if (*(int *)((ulong)(t->array).ptr32 + 4 + (ulong)i * 8) != -1) {
          n = n + 1;
        }
      }
      bins[b] = n + bins[b];
      na = n + na;
      b = b + 1;
    }
    local_4 = na;
  }
  return local_4;
}

Assistant:

static uint32_t countarray(const GCtab *t, uint32_t *bins)
{
  uint32_t na, b, i;
  if (t->asize == 0) return 0;
  for (na = i = b = 0; b < LJ_MAX_ABITS; b++) {
    uint32_t n, top = 2u << b;
    TValue *array;
    if (top >= t->asize) {
      top = t->asize-1;
      if (i > top)
	break;
    }
    array = tvref(t->array);
    for (n = 0; i <= top; i++)
      if (!tvisnil(&array[i]))
	n++;
    bins[b] += n;
    na += n;
  }
  return na;
}